

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SingleFileErrorCollector::
~SingleFileErrorCollector(SingleFileErrorCollector *this)

{
  SingleFileErrorCollector *this_local;
  
  (this->super_ErrorCollector)._vptr_ErrorCollector =
       (_func_int **)&PTR__SingleFileErrorCollector_02a46170;
  std::__cxx11::string::~string((string *)&this->filename_);
  protobuf::io::ErrorCollector::~ErrorCollector(&this->super_ErrorCollector);
  return;
}

Assistant:

~SingleFileErrorCollector() override {}